

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<TPZVec<int>_>::Resize(TPZVec<TPZVec<int>_> *this,int64_t newsize,TPZVec<int> *object)

{
  void *pvVar1;
  int64_t *piVar2;
  TPZVec<int> *pTVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  TPZVec<int> *pTVar7;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar4 = this->fNElements;
  if (lVar4 != newsize) {
    if (newsize == 0) {
      pTVar7 = (TPZVec<int> *)0x0;
    }
    else {
      piVar2 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize * 0x20 | 8)
      ;
      *piVar2 = newsize;
      pTVar7 = (TPZVec<int> *)(piVar2 + 1);
      pTVar3 = pTVar7;
      do {
        pTVar3->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
        pTVar3->fStore = (int *)0x0;
        pTVar3->fNElements = 0;
        pTVar3->fNAlloc = 0;
        pTVar3 = pTVar3 + 1;
      } while (pTVar3 != (TPZVec<int> *)(piVar2 + newsize * 4 + 1));
    }
    if (newsize <= lVar4) {
      lVar4 = newsize;
    }
    if (lVar4 < 1) {
      lVar4 = 0;
    }
    else {
      lVar5 = 0;
      lVar6 = lVar4;
      do {
        TPZVec<int>::operator=
                  ((TPZVec<int> *)((long)&pTVar7->_vptr_TPZVec + lVar5),
                   (TPZVec<int> *)((long)&this->fStore->_vptr_TPZVec + lVar5));
        lVar5 = lVar5 + 0x20;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    lVar6 = newsize - lVar4;
    if (lVar6 != 0 && lVar4 <= newsize) {
      pTVar3 = pTVar7 + lVar4;
      do {
        TPZVec<int>::operator=(pTVar3,object);
        pTVar3 = pTVar3 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    pTVar3 = this->fStore;
    if (pTVar3 != (TPZVec<int> *)0x0) {
      lVar4 = pTVar3[-1].fNAlloc;
      if (lVar4 != 0) {
        lVar6 = lVar4 << 5;
        do {
          *(undefined ***)((long)&pTVar3[-1]._vptr_TPZVec + lVar6) = &PTR__TPZVec_01813ef0;
          pvVar1 = *(void **)((long)pTVar3 + lVar6 + -0x18);
          if (pvVar1 != (void *)0x0) {
            operator_delete__(pvVar1);
          }
          lVar6 = lVar6 + -0x20;
        } while (lVar6 != 0);
      }
      operator_delete__(&pTVar3[-1].fNAlloc,lVar4 << 5 | 8);
    }
    this->fStore = pTVar7;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}